

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O1

void __thiscall
btMatrix3x3::diagonalize(btMatrix3x3 *this,btMatrix3x3 *rot,btScalar threshold,int maxSteps)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  rot->m_el[0].m_floats[0] = 1.0;
  rot->m_el[0].m_floats[1] = 0.0;
  rot->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)(rot->m_el[0].m_floats + 3) = 0;
  rot->m_el[1].m_floats[1] = 1.0;
  rot->m_el[1].m_floats[2] = 0.0;
  rot->m_el[1].m_floats[3] = 0.0;
  rot->m_el[2].m_floats[0] = 0.0;
  rot->m_el[2].m_floats[1] = 0.0;
  rot->m_el[2].m_floats[2] = 1.0;
  rot->m_el[2].m_floats[3] = 0.0;
  if (0 < maxSteps) {
    do {
      fVar12 = ABS(this->m_el[0].m_floats[1]);
      fVar14 = ABS(this->m_el[0].m_floats[2]);
      fVar13 = fVar14;
      if (fVar14 <= fVar12) {
        fVar13 = fVar12;
      }
      fVar11 = ABS(this->m_el[1].m_floats[2]);
      bVar1 = fVar11 <= fVar13;
      if (bVar1) {
        iVar6 = 2 - (uint)(fVar12 < fVar14);
        iVar7 = (fVar12 < fVar14) + 1;
      }
      else {
        iVar7 = 2;
        iVar6 = 0;
        fVar13 = fVar11;
      }
      bVar1 = !bVar1;
      fVar12 = (ABS(this->m_el[2].m_floats[2]) +
               ABS(this->m_el[1].m_floats[1]) + ABS(this->m_el[0].m_floats[0])) * threshold;
      iVar5 = maxSteps;
      if ((fVar12 < fVar13) || (iVar5 = 1, fVar12 * 1.1920929e-07 < fVar13)) {
        fVar13 = *(float *)((long)this->m_el[bVar1].m_floats + (ulong)(uint)(iVar7 * 4));
        uVar10 = iVar7 << 4;
        fVar14 = (*(float *)((long)this->m_el[0].m_floats + (ulong)(uint)(iVar7 * 4) + (ulong)uVar10
                            ) - this->m_el[bVar1].m_floats[bVar1]) / (fVar13 + fVar13);
        fVar12 = fVar14 * fVar14;
        if (8.388608e+07 <= fVar12 * fVar12) {
          fVar14 = 1.0 / (fVar14 * (0.5 / fVar12 + 2.0));
          fVar12 = fVar14 * -0.5 * fVar14 + 1.0;
        }
        else {
          fVar12 = fVar12 + 1.0;
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          fVar14 = 1.0 / ((float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12 |
                                 (uint)-fVar12 & -(uint)(fVar14 < 0.0)) + fVar14);
          fVar12 = fVar14 * fVar14 + 1.0;
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          fVar12 = 1.0 / fVar12;
        }
        fVar11 = fVar14 * fVar12;
        uVar2 = (ulong)bVar1;
        lVar9 = uVar2 * 4;
        *(undefined4 *)((long)this->m_el[0].m_floats + lVar9 + (ulong)uVar10) = 0;
        uVar8 = (ulong)(uint)(iVar7 << 2);
        *(undefined4 *)((long)this->m_el[bVar1].m_floats + uVar8) = 0;
        this->m_el[bVar1].m_floats[uVar2] = this->m_el[bVar1].m_floats[uVar2] - fVar14 * fVar13;
        *(float *)((long)this->m_el[0].m_floats + uVar8 + uVar10) =
             fVar14 * fVar13 + *(float *)((long)this->m_el[0].m_floats + uVar8 + uVar10);
        uVar3 = iVar6 << 4;
        fVar13 = *(float *)((long)this->m_el[0].m_floats + lVar9 + (ulong)uVar3);
        fVar14 = *(float *)((long)this->m_el[0].m_floats + uVar8 + uVar3);
        fVar15 = fVar12 * fVar13 - fVar14 * fVar11;
        *(float *)((long)this->m_el[bVar1].m_floats + (ulong)(uint)(iVar6 << 2)) = fVar15;
        *(float *)((long)this->m_el[0].m_floats + lVar9 + (ulong)uVar3) = fVar15;
        fVar13 = fVar13 * fVar11 + fVar12 * fVar14;
        *(float *)((long)this->m_el[0].m_floats + (ulong)(uint)(iVar6 << 2) + (ulong)uVar10) =
             fVar13;
        *(float *)((long)this->m_el[0].m_floats + uVar8 + uVar3) = fVar13;
        lVar4 = 0;
        do {
          fVar13 = *(float *)((long)rot->m_el[0].m_floats + lVar4 + lVar9);
          fVar14 = *(float *)((long)rot->m_el[0].m_floats + lVar4 + uVar8);
          *(float *)((long)rot->m_el[0].m_floats + lVar4 + lVar9) =
               fVar12 * fVar13 + fVar14 * -fVar11;
          *(float *)((long)rot->m_el[0].m_floats + lVar4 + uVar8) =
               fVar14 * fVar12 + fVar13 * fVar11;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x30);
        bVar1 = true;
      }
      else {
        bVar1 = false;
        iVar5 = maxSteps;
      }
    } while ((bVar1) && (maxSteps = iVar5 + -1, 1 < iVar5));
  }
  return;
}

Assistant:

void diagonalize(btMatrix3x3& rot, btScalar threshold, int maxSteps)
	{
		rot.setIdentity();
		for (int step = maxSteps; step > 0; step--)
		{
			// find off-diagonal element [p][q] with largest magnitude
			int p = 0;
			int q = 1;
			int r = 2;
			btScalar max = btFabs(m_el[0][1]);
			btScalar v = btFabs(m_el[0][2]);
			if (v > max)
			{
				q = 2;
				r = 1;
				max = v;
			}
			v = btFabs(m_el[1][2]);
			if (v > max)
			{
				p = 1;
				q = 2;
				r = 0;
				max = v;
			}

			btScalar t = threshold * (btFabs(m_el[0][0]) + btFabs(m_el[1][1]) + btFabs(m_el[2][2]));
			if (max <= t)
			{
				if (max <= SIMD_EPSILON * t)
				{
					return;
				}
				step = 1;
			}

			// compute Jacobi rotation J which leads to a zero for element [p][q] 
			btScalar mpq = m_el[p][q];
			btScalar theta = (m_el[q][q] - m_el[p][p]) / (2 * mpq);
			btScalar theta2 = theta * theta;
			btScalar cos;
			btScalar sin;
			if (theta2 * theta2 < btScalar(10 / SIMD_EPSILON))
			{
				t = (theta >= 0) ? 1 / (theta + btSqrt(1 + theta2))
					: 1 / (theta - btSqrt(1 + theta2));
				cos = 1 / btSqrt(1 + t * t);
				sin = cos * t;
			}
			else
			{
				// approximation for large theta-value, i.e., a nearly diagonal matrix
				t = 1 / (theta * (2 + btScalar(0.5) / theta2));
				cos = 1 - btScalar(0.5) * t * t;
				sin = cos * t;
			}

			// apply rotation to matrix (this = J^T * this * J)
			m_el[p][q] = m_el[q][p] = 0;
			m_el[p][p] -= t * mpq;
			m_el[q][q] += t * mpq;
			btScalar mrp = m_el[r][p];
			btScalar mrq = m_el[r][q];
			m_el[r][p] = m_el[p][r] = cos * mrp - sin * mrq;
			m_el[r][q] = m_el[q][r] = cos * mrq + sin * mrp;

			// apply rotation to rot (rot = rot * J)
			for (int i = 0; i < 3; i++)
			{
				btVector3& row = rot[i];
				mrp = row[p];
				mrq = row[q];
				row[p] = cos * mrp - sin * mrq;
				row[q] = cos * mrq + sin * mrp;
			}
		}
	}